

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall
GlobOpt::ProcessValueKillsForLoopHeaderAfterBackEdgeMerge
          (GlobOpt *this,BasicBlock *block,GlobOptBlockData *blockData)

{
  BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  Value *this_01;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ValueType newValueType;
  int iVar6;
  undefined4 *puVar7;
  Value **ppVVar8;
  ValueInfo *pVVar9;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar10;
  ValueType *this_02;
  ArrayValueInfo *pAVar11;
  StackSym *pSVar12;
  bool removeLength;
  bool removeHeadSegmentLength;
  bool removeHeadSegment;
  ArrayValueInfo *arrayValueInfo;
  bool isVirtualTypedArray;
  bool isJsArray;
  ValueInfo *valueInfo;
  Value *value;
  BucketEntryIterator<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  it;
  JsArrayKills loopKills;
  ValueSet *valuesToKillOnCalls;
  GlobOptBlockData *blockData_local;
  BasicBlock *block_local;
  GlobOpt *this_local;
  
  if (block == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3415,"(block)","block");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if ((*(ushort *)&block->field_0x18 >> 2 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3416,"(block->isLoopHeader)","block->isLoopHeader");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (blockData == (GlobOptBlockData *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3417,"(blockData)","blockData");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  this_00 = blockData->valuesToKillOnCalls;
  iVar6 = JsUtil::
          BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::Count(this_00);
  if (iVar6 != 0) {
    it.indexOfEntryAfterRemovedEntry._3_1_ = (block->loop->jsArrayKills).field_0;
    JsUtil::
    BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::GetIteratorWithRemovalSupport
              ((BucketEntryIterator<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                *)&value,this_00);
    while (bVar2 = JsUtil::
                   BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   ::
                   BucketEntryIterator<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                   ::IsValid((BucketEntryIterator<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                              *)&value), bVar2) {
      ppVVar8 = JsUtil::
                BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                ::
                IteratorBase<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::BucketEntryIterator<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                ::CurrentValue((IteratorBase<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::BucketEntryIterator<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                                *)&value);
      this_01 = *ppVVar8;
      pVVar9 = ::Value::GetValueInfo(this_01);
      bVar2 = ValueType::IsArrayOrObjectWithArray(&pVVar9->super_ValueType);
      if ((!bVar2) &&
         (bVar2 = ValueType::IsOptimizedVirtualTypedArray(&pVVar9->super_ValueType), !bVar2)) {
        bVar2 = ValueType::IsOptimizedTypedArray(&pVVar9->super_ValueType);
        if (bVar2) {
          pAVar11 = ValueInfo::AsArrayValueInfo(pVVar9);
          pSVar12 = ArrayValueInfo::HeadSegmentLengthSym(pAVar11);
          if (pSVar12 != (StackSym *)0x0) goto LAB_005ae4ea;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x3427,
                           "(valueInfo->IsArrayOrObjectWithArray() || valueInfo->IsOptimizedVirtualTypedArray() || valueInfo->IsOptimizedTypedArray() && valueInfo->AsArrayValueInfo()->HeadSegmentLengthSym())"
                           ,
                           "valueInfo->IsArrayOrObjectWithArray() || valueInfo->IsOptimizedVirtualTypedArray() || valueInfo->IsOptimizedTypedArray() && valueInfo->AsArrayValueInfo()->HeadSegmentLengthSym()"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
LAB_005ae4ea:
      bVar2 = ValueType::IsArrayOrObjectWithArray(&pVVar9->super_ValueType);
      bVar3 = ValueType::IsOptimizedTypedArray(&pVVar9->super_ValueType);
      if ((bool)((bVar2 ^ 0xffU) & 1) != bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x342a,"(!isJsArray == valueInfo->IsOptimizedTypedArray())",
                           "!isJsArray == valueInfo->IsOptimizedTypedArray()");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      bVar3 = ValueType::IsOptimizedVirtualTypedArray(&pVVar9->super_ValueType);
      if ((bVar2) || (bVar3)) {
        paVar10 = &ValueInfo::Type(pVVar9)->field_0;
        bVar4 = JsArrayKills::KillsValueType
                          ((JsArrayKills *)((long)&it.indexOfEntryAfterRemovedEntry + 3),
                           (ValueType)*(anon_union_2_4_ea848c7b_for_ValueType_13 *)&paVar10->field_0
                          );
        if (bVar4) goto LAB_005ae5f0;
LAB_005ae6a2:
        if ((bVar2) && (bVar2 = ValueInfo::IsArrayValueInfo(pVVar9), bVar2)) {
          pAVar11 = ValueInfo::AsArrayValueInfo(pVVar9);
          bVar3 = JsArrayKills::KillsArrayHeadSegments
                            ((JsArrayKills *)((long)&it.indexOfEntryAfterRemovedEntry + 3));
          bVar2 = false;
          if (bVar3) {
            pSVar12 = ArrayValueInfo::HeadSegmentSym(pAVar11);
            bVar2 = pSVar12 != (StackSym *)0x0;
          }
          bVar4 = JsArrayKills::KillsArrayHeadSegmentLengths
                            ((JsArrayKills *)((long)&it.indexOfEntryAfterRemovedEntry + 3));
          bVar3 = false;
          if (bVar4) {
            pSVar12 = ArrayValueInfo::HeadSegmentLengthSym(pAVar11);
            bVar3 = pSVar12 != (StackSym *)0x0;
          }
          bVar5 = JsArrayKills::KillsArrayLengths
                            ((JsArrayKills *)((long)&it.indexOfEntryAfterRemovedEntry + 3));
          bVar4 = false;
          if (bVar5) {
            pSVar12 = ArrayValueInfo::LengthSym(pAVar11);
            bVar4 = pSVar12 != (StackSym *)0x0;
          }
          if (((bVar2) || (bVar3)) || (bVar4)) {
            pVVar9 = ArrayValueInfo::Copy
                               (pAVar11,this->alloc,(bool)(bVar2 ^ 1),(bool)(bVar3 ^ 1),
                                (bool)(bVar4 ^ 1));
            ChangeValueInfo(this,(BasicBlock *)0x0,this_01,pVVar9,false,false);
            ::Value::GetValueInfo(this_01);
          }
        }
      }
      else {
        bVar4 = JsArrayKills::KillsTypedArrayHeadSegmentLengths
                          ((JsArrayKills *)((long)&it.indexOfEntryAfterRemovedEntry + 3));
        if (!bVar4) goto LAB_005ae6a2;
LAB_005ae5f0:
        if ((bVar2) || (bVar3)) {
          this_02 = ValueInfo::Type(pVVar9);
          newValueType = ValueType::ToLikely(this_02);
          ChangeValueType(this,(BasicBlock *)0x0,this_01,newValueType,false,false);
        }
        else {
          pAVar11 = ValueInfo::AsArrayValueInfo(pVVar9);
          pVVar9 = ArrayValueInfo::Copy(pAVar11,this->alloc,true,false,true);
          ChangeValueInfo(this,(BasicBlock *)0x0,this_01,pVVar9,false,false);
        }
        JsUtil::
        BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::
        BucketEntryIterator<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
        ::RemoveCurrent((BucketEntryIterator<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                         *)&value);
      }
      JsUtil::
      BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::
      BucketEntryIterator<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
      ::MoveNext((BucketEntryIterator<JsUtil::BaseHashSet<Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Value_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                  *)&value);
    }
  }
  return;
}

Assistant:

void
GlobOpt::ProcessValueKillsForLoopHeaderAfterBackEdgeMerge(BasicBlock *const block, GlobOptBlockData *const blockData)
{
    Assert(block);
    Assert(block->isLoopHeader);
    Assert(blockData);

    ValueSet *const valuesToKillOnCalls = blockData->valuesToKillOnCalls;
    if(valuesToKillOnCalls->Count() == 0)
    {
        return;
    }

    const JsArrayKills loopKills(block->loop->jsArrayKills);
    for(auto it = valuesToKillOnCalls->GetIteratorWithRemovalSupport(); it.IsValid(); it.MoveNext())
    {
        Value *const value = it.CurrentValue();
        ValueInfo *valueInfo = value->GetValueInfo();
        Assert(
            valueInfo->IsArrayOrObjectWithArray() ||
            valueInfo->IsOptimizedVirtualTypedArray() ||
            valueInfo->IsOptimizedTypedArray() && valueInfo->AsArrayValueInfo()->HeadSegmentLengthSym());

        const bool isJsArray = valueInfo->IsArrayOrObjectWithArray();
        Assert(!isJsArray == valueInfo->IsOptimizedTypedArray());

        const bool isVirtualTypedArray = valueInfo->IsOptimizedVirtualTypedArray();

        if((isJsArray || isVirtualTypedArray) ? loopKills.KillsValueType(valueInfo->Type()) : loopKills.KillsTypedArrayHeadSegmentLengths())
        {
            // Hoisting array checks and other related things for this type is disabled for the loop due to the kill, as
            // compensation code is currently not added on back-edges. When merging values from a back-edge, the array value
            // type cannot be definite, as that may require adding compensation code on the back-edge if the optimization pass
            // chooses to not optimize the array.
            if(isJsArray || isVirtualTypedArray)
            {
                ChangeValueType(nullptr, value, valueInfo->Type().ToLikely(), false);
            }
            else
            {
                ChangeValueInfo(
                    nullptr,
                    value,
                    valueInfo->AsArrayValueInfo()->Copy(alloc, true, false /* copyHeadSegmentLength */, true));
            }
            it.RemoveCurrent();
            continue;
        }

        if(!isJsArray || !valueInfo->IsArrayValueInfo())
        {
            continue;
        }

        // Similarly, if the loop contains an operation that kills JS array segments, don't make the segment or other related
        // syms available initially inside the loop
        ArrayValueInfo *const arrayValueInfo = valueInfo->AsArrayValueInfo();
        const bool removeHeadSegment = loopKills.KillsArrayHeadSegments() && arrayValueInfo->HeadSegmentSym();
        const bool removeHeadSegmentLength = loopKills.KillsArrayHeadSegmentLengths() && arrayValueInfo->HeadSegmentLengthSym();
        const bool removeLength = loopKills.KillsArrayLengths() && arrayValueInfo->LengthSym();
        if(removeHeadSegment || removeHeadSegmentLength || removeLength)
        {
            ChangeValueInfo(
                nullptr,
                value,
                arrayValueInfo->Copy(alloc, !removeHeadSegment, !removeHeadSegmentLength, !removeLength));
            valueInfo = value->GetValueInfo();
        }
    }
}